

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

opj_bool jp2_read_jp2h_v2(opj_jp2_v2_t *jp2,uchar *p_header_data,uint p_header_size,
                         opj_event_mgr_t *p_manager)

{
  byte *pbVar1;
  OPJ_UINT32 OVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  OPJ_UINT32 OVar8;
  opj_bool oVar9;
  ulong uVar10;
  bool bVar11;
  OPJ_UINT32 l_value;
  opj_event_mgr_t *local_48;
  OPJ_UINT32 local_3c;
  opj_jp2_v2_t *local_38;
  
  if ((jp2->jp2_state & 2) == 0) {
    pcVar7 = "The  box must be the first box in the file.\n";
LAB_001e65e9:
    oVar9 = 0;
    opj_event_msg_v2(p_manager,1,pcVar7);
  }
  else {
    jp2->jp2_img_state = 0;
    local_48 = p_manager;
    local_38 = jp2;
    while (p_header_size != 0) {
      if (p_header_size < 8) {
        pcVar7 = "Cannot handle box of less than 8 bytes\n";
LAB_001e65c8:
        p_manager = local_48;
        opj_event_msg_v2(local_48,1,pcVar7);
        pcVar7 = "Stream error while reading JP2 Header box\n";
        goto LAB_001e65e9;
      }
      opj_read_bytes_LE(p_header_data,&l_value,4);
      OVar8 = l_value;
      opj_read_bytes_LE(p_header_data + 4,&l_value,4);
      OVar2 = l_value;
      if (OVar8 == 1) {
        if (p_header_size < 0x10) {
          pcVar7 = "Cannot handle XL box of less than 16 bytes\n";
        }
        else {
          opj_read_bytes_LE(p_header_data + 8,&local_3c,4);
          if (local_3c == 0) {
            opj_read_bytes_LE(p_header_data + 0xc,&l_value,4);
            if (l_value == 0) goto LAB_001e659c;
            uVar4 = 0x10;
            OVar8 = l_value;
            goto LAB_001e652d;
          }
          pcVar7 = "Cannot handle box sizes higher than 2^32\n";
        }
        goto LAB_001e65c8;
      }
      uVar4 = 8;
      if (OVar8 == 0) {
LAB_001e659c:
        pcVar7 = "Cannot handle box of undefined sizes\n";
        goto LAB_001e65c8;
      }
LAB_001e652d:
      jp2 = local_38;
      bVar11 = p_header_size < OVar8;
      p_header_size = p_header_size - OVar8;
      if (bVar11) {
        pcVar7 = "Stream error while reading JP2 Header box: box length is inconsistent.\n";
        p_manager = local_48;
        goto LAB_001e65e9;
      }
      lVar3 = 0;
      do {
        lVar6 = lVar3;
        if (lVar6 + 0x10 == 0x70) {
          uVar10 = (ulong)(OVar8 - uVar4);
          pbVar1 = (byte *)((long)&local_38->jp2_img_state + 3);
          *pbVar1 = *pbVar1 | 0x80;
          goto LAB_001e6578;
        }
        lVar3 = lVar6 + 0x10;
      } while (*(OPJ_UINT32 *)((long)&jp2_img_header[0].id + lVar6) != OVar2);
      uVar10 = (ulong)(OVar8 - uVar4);
      iVar5 = (**(code **)((long)&jp2_img_header[0].handler + lVar6))
                        (local_38,p_header_data + uVar4,uVar10);
      if (iVar5 == 0) {
        return 0;
      }
LAB_001e6578:
      p_header_data = p_header_data + uVar10 + uVar4;
    }
    *(byte *)&jp2->jp2_state = (byte)jp2->jp2_state | 4;
    oVar9 = 1;
  }
  return oVar9;
}

Assistant:

opj_bool jp2_read_jp2h_v2(
						opj_jp2_v2_t *jp2,
						unsigned char * p_header_data,
						unsigned int p_header_size,
						opj_event_mgr_t * p_manager
					)
{
	OPJ_UINT32 l_box_size=0, l_current_data_size = 0;
	opj_jp2_box_t box;
	const opj_jp2_header_handler_t * l_current_handler;

	/* preconditions */
	assert(p_header_data != 00);
	assert(jp2 != 00);
	assert(p_manager != 00);

	/* make sure the box is well placed */
	if ((jp2->jp2_state & JP2_STATE_FILE_TYPE) != JP2_STATE_FILE_TYPE ) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "The  box must be the first box in the file.\n");
		return OPJ_FALSE;
	}

	jp2->jp2_img_state = JP2_IMG_STATE_NONE;

	/* iterate while remaining data */
	while (p_header_size > 0) {

		if (! jp2_read_boxhdr_char(&box,p_header_data,&l_box_size,p_header_size, p_manager)) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Stream error while reading JP2 Header box\n");
			return OPJ_FALSE;
		}

		if (box.length > p_header_size) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Stream error while reading JP2 Header box: box length is inconsistent.\n");
			return OPJ_FALSE;
		}

		l_current_handler = jp2_img_find_handler(box.type);
		l_current_data_size = box.length - l_box_size;
		p_header_data += l_box_size;

		if (l_current_handler != 00) {
			if (! l_current_handler->handler(jp2,p_header_data,l_current_data_size,p_manager)) {
				return OPJ_FALSE;
			}
		}
		else {
			jp2->jp2_img_state |= JP2_IMG_STATE_UNKNOWN;
		}

		p_header_data += l_current_data_size;
		p_header_size -= box.length;
	}

	jp2->jp2_state |= JP2_STATE_HEADER;

	return OPJ_TRUE;
}